

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O3

FunctionResult * __thiscall
wasm::ExecutionResults::run
          (FunctionResult *__return_storage_ptr__,ExecutionResults *this,Function *func,Module *wasm
          ,ModuleRunner *instance)

{
  string_view name;
  char cVar1;
  Type *pTVar2;
  SmallVector<wasm::Literal,_1UL> local_100;
  Type local_c8;
  undefined1 local_c0 [32];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_a0;
  undefined1 auStack_88 [8];
  Literals arguments;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)instance;
  local_c8.id = ::wasm::HeapType::getSignature();
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_40 = (undefined1  [8])&local_c8;
  pTVar2 = (Type *)Type::size(&local_c8);
  if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent == pTVar2)
  goto LAB_001aef11;
  do {
    do {
      ::wasm::Type::Iterator::operator*((Iterator *)local_40);
      cVar1 = ::wasm::Type::isDefaultable();
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "[trap fuzzer can only send defaultable parameters to exports]\n",0x3e);
        (__return_storage_ptr__->
        super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        ).
        super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        ._M_index = '\x01';
        goto LAB_001af033;
      }
      ::wasm::Literal::makeZero((Type)local_c0);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_88,(Literal *)local_c0);
      ::wasm::Literal::~Literal((Literal *)local_c0);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar2);
LAB_001aef11:
  } while (local_40 != (undefined1  [8])&local_c8);
  name = (func->super_Importable).super_Named.name.super_IString.str;
  SmallVector<wasm::Literal,_1UL>::SmallVector
            (&local_100,(SmallVector<wasm::Literal,_1UL> *)auStack_88);
  ModuleRunnerBase<wasm::ModuleRunner>::callFunction
            ((Literals *)local_c0,
             (ModuleRunnerBase<wasm::ModuleRunner> *)
             arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(Name)name,(Literals *)&local_100);
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    ).
    super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    .
    super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    .
    super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    .
    super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    .
    super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
    ._M_u = local_c0._0_8_;
  ::wasm::Literal::Literal
            ((Literal *)
             ((long)&(__return_storage_ptr__->
                     super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ).
                     super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ._M_u + 8),(Literal *)(local_c0 + 8));
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ).
           super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ._M_u + 0x20) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ).
           super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ._M_u + 0x28) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ).
           super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ._M_u + 0x30) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  ).
  super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  .
  super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  .
  super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  .
  super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  .
  super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  ._M_index = '\0';
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_a0);
  ::wasm::Literal::~Literal((Literal *)(local_c0 + 8));
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_100.flexible);
  ::wasm::Literal::~Literal(local_100.fixed._M_elems);
LAB_001af033:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&arguments);
  return __return_storage_ptr__;
}

Assistant:

FunctionResult run(Function* func, Module& wasm, ModuleRunner& instance) {
    try {
      // call the method
      Literals arguments;
      for (const auto& param : func->getParams()) {
        // zeros in arguments TODO: more?
        if (!param.isDefaultable()) {
          std::cout << "[trap fuzzer can only send defaultable parameters to "
                       "exports]\n";
          return Trap{};
        }
        arguments.push_back(Literal::makeZero(param));
      }
      return instance.callFunction(func->name, arguments);
    } catch (const TrapException&) {
      return Trap{};
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      return Exception{};
    } catch (const HostLimitException&) {
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
      return {};
    }
  }